

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ExplicitProducer::
enqueue<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0,_zframe_t*const&>
          (ExplicitProducer *this,_zframe_t **element)

{
  ulong idx;
  BlockIndexEntry *pBVar1;
  long lVar2;
  __int_type _Var3;
  bool bVar4;
  ulong *numberOfFilledSlotsToExpose;
  Block *pBVar5;
  __pointer_type pBVar6;
  _zframe_t **pp_Var7;
  undefined8 *in_RSI;
  long in_RDI;
  atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>
  *this_00;
  BlockIndexEntry *entry;
  Block *newBlock;
  __int_type head;
  size_t originalBlockIndexSlotsUsed;
  Block *startBlock;
  index_t newTailIndex;
  index_t currentTailIndex;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined4 in_stack_fffffffffffffef0;
  memory_order in_stack_fffffffffffffef4;
  Block *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar8;
  
  numberOfFilledSlotsToExpose = (ulong *)(in_RDI + 0x20);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar8 = 0;
  idx = *numberOfFilledSlotsToExpose;
  if ((idx & 0xff) == 0) {
    if ((*(long *)(in_RDI + 0x40) == 0) ||
       (bVar4 = Block::
                is_empty<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::InnerQueueContext)1>
                          (in_stack_fffffffffffffef8), !bVar4)) {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      bVar4 = details::circular_less_than<unsigned_long>
                        (*(unsigned_long *)(in_RDI + 0x28),idx + 0x100);
      if (!bVar4) {
        return false;
      }
      if (((*(long *)(in_RDI + 0x80) == 0) || (*(long *)(in_RDI + 0x60) == *(long *)(in_RDI + 0x68))
          ) && (bVar4 = ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::new_block_index
                                  ((ExplicitProducer *)CONCAT44(uVar8,in_stack_ffffffffffffff38),
                                   (size_t)numberOfFilledSlotsToExpose), !bVar4)) {
        return false;
      }
      pBVar5 = requisition_block<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0>
                         ((ConcurrentQueue<_zframe_t_*,_MyTraits> *)in_stack_fffffffffffffef8);
      if (pBVar5 == (Block *)0x0) {
        return false;
      }
      Block::reset_empty<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::InnerQueueContext)1>
                ((Block *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      if (*(long *)(in_RDI + 0x40) == 0) {
        pBVar5->next = pBVar5;
      }
      else {
        pBVar5->next = *(Block **)(*(long *)(in_RDI + 0x40) + 0x800);
        *(Block **)(*(long *)(in_RDI + 0x40) + 0x800) = pBVar5;
      }
      *(Block **)(in_RDI + 0x40) = pBVar5;
      *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 1;
    }
    else {
      *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x800);
      Block::reset_empty<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::InnerQueueContext)1>
                ((Block *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    this_00 = (atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>
               *)(in_RDI + 0x58);
    pBVar6 = std::
             atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>
             ::load(this_00,in_stack_fffffffffffffef4);
    pBVar1 = pBVar6->entries;
    lVar2 = *(long *)(in_RDI + 0x70);
    pBVar1[lVar2].base = idx;
    pBVar1[lVar2].block = *(Block **)(in_RDI + 0x40);
    pBVar6 = std::
             atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>
             ::load(this_00,in_stack_fffffffffffffef4);
    _Var3 = *(__int_type *)(in_RDI + 0x70);
    std::operator&(memory_order_release,__memory_order_mask);
    (pBVar6->front).super___atomic_base<unsigned_long>._M_i = _Var3;
    *(ulong *)(in_RDI + 0x70) = *(long *)(in_RDI + 0x70) + 1U & *(long *)(in_RDI + 0x68) - 1U;
  }
  pp_Var7 = ConcurrentQueue<_zframe_t_*,_MyTraits>::Block::operator[]
                      (*(Block **)(in_RDI + 0x40),idx);
  *pp_Var7 = (_zframe_t *)*in_RSI;
  std::operator&(memory_order_release,__memory_order_mask);
  *(ulong *)(in_RDI + 0x20) = idx + 1;
  return true;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto startBlock = this->tailBlock;
				auto originalBlockIndexSlotsUsed = pr_blockIndexSlotsUsed;
				if (this->tailBlock != nullptr && this->tailBlock->next->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
					// We can re-use the block ahead of us, it's empty!					
					this->tailBlock = this->tailBlock->next;
					this->tailBlock->ConcurrentQueue::Block::template reset_empty<explicit_context>();
					
					// We'll put the block on the block index (guaranteed to be room since we're conceptually removing the
					// last block from it first -- except instead of removing then adding, we can just overwrite).
					// Note that there must be a valid block index here, since even if allocation failed in the ctor,
					// it would have been re-attempted when adding the first block to the queue; since there is such
					// a block, a block index must have been successfully allocated.
				}
				else {
					// Whatever head value we see here is >= the last value we saw here (relatively),
					// and <= its current value. Since we have the most recent tail, the head must be
					// <= to it.
					auto head = this->headIndex.load(std::memory_order_relaxed);
					assert(!details::circular_less_than<index_t>(currentTailIndex, head));
					if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE)
						|| (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
						// We can't enqueue in another block because there's not enough leeway -- the
						// tail could surpass the head by the time the block fills up! (Or we'll exceed
						// the size limit, if the second part of the condition was true.)
						return false;
					}
					// We're going to need a new block; check that the block index has room
					if (pr_blockIndexRaw == nullptr || pr_blockIndexSlotsUsed == pr_blockIndexSize) {
						// Hmm, the circular block index is already full -- we'll need
						// to allocate a new index. Note pr_blockIndexRaw can only be nullptr if
						// the initial allocation failed in the constructor.
						
						if (allocMode == CannotAlloc || !new_block_index(pr_blockIndexSlotsUsed)) {
							return false;
						}
					}
					
					// Insert a new block in the circular linked list
					auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
					if (newBlock == nullptr) {
						return false;
					}
#if MCDBGQ_TRACKMEM
					newBlock->owner = this;
#endif
					newBlock->ConcurrentQueue::Block::template reset_empty<explicit_context>();
					if (this->tailBlock == nullptr) {
						newBlock->next = newBlock;
					}
					else {
						newBlock->next = this->tailBlock->next;
						this->tailBlock->next = newBlock;
					}
					this->tailBlock = newBlock;
					++pr_blockIndexSlotsUsed;
				}
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					// The constructor may throw. We want the element not to appear in the queue in
					// that case (without corrupting the queue):
					MOODYCAMEL_TRY {
						new ((*this->tailBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						// Revert change to the current block, but leave the new block available
						// for next time
						pr_blockIndexSlotsUsed = originalBlockIndexSlotsUsed;
						this->tailBlock = startBlock == nullptr ? this->tailBlock : startBlock;
						MOODYCAMEL_RETHROW;
					}
				}
				else {
					(void)startBlock;
					(void)originalBlockIndexSlotsUsed;
				}
				
				// Add block to block index
				auto& entry = blockIndex.load(std::memory_order_relaxed)->entries[pr_blockIndexFront];
				entry.base = currentTailIndex;
				entry.block = this->tailBlock;
				blockIndex.load(std::memory_order_relaxed)->front.store(pr_blockIndexFront, std::memory_order_release);
				pr_blockIndexFront = (pr_blockIndexFront + 1) & (pr_blockIndexSize - 1);
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}